

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::StringFixture::convert<unsigned_char*>
          (string *__return_storage_ptr__,void *this,uchar *begin,uchar *end)

{
  allocator<char> local_49;
  string local_48;
  uchar *local_28;
  uchar *end_local;
  uchar *begin_local;
  StringFixture *this_local;
  
  local_28 = end;
  end_local = begin;
  begin_local = (uchar *)this;
  this_local = (StringFixture *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<unsigned_char*,void>((string *)&local_48,begin,end,&local_49);
  anon_unknown.dwarf_e9cea::StringFixture::convert
            (__return_storage_ptr__,(StringFixture *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFixture::convert (InputIterator begin, InputIterator end) const {
        return this->convert ({begin, end});
    }